

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

void __thiscall SocketInternals::~SocketInternals(SocketInternals *this)

{
  Close(this);
  std::__cxx11::string::~string((string *)&this->InterfaceName);
  return;
}

Assistant:

SocketInternals::~SocketInternals()
{
    Close();
}